

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void pmaxsb_(PDISASM pMyDisasm)

{
  if ((pMyDisasm->Prefix).OperandSize != '\x01') {
    failDecode(pMyDisasm);
    return;
  }
  (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
  (pMyDisasm->Prefix).OperandSize = '\b';
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpmaxsb",8);
    if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x03';
    }
    ArgsVEX(pMyDisasm);
    return;
  }
  (pMyDisasm->Instruction).Category = 0x80000;
  (pMyDisasm->Reserved_).MemDecoration = 0x6d;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"pmaxsb",7);
  (pMyDisasm->Reserved_).Register_ = 4;
  GxEx(pMyDisasm);
  (pMyDisasm->Operand1).AccessMode = 3;
  return;
}

Assistant:

void __bea_callspec__ pmaxsb_(PDISASM pMyDisasm)
{
   /* ========== 0x66 */
   if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       if (GV.VEX.state == InUsePrefix) {
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpmaxsb");
         #endif
         if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL_MEM;
         ArgsVEX(pMyDisasm);
       } else {
         pMyDisasm->Instruction.Category = SSE41_INSTRUCTION;
         GV.MemDecoration = Arg2_m128_xmm;
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pmaxsb");
         #endif
         GV.Register_ = SSE_REG;
         GxEx(pMyDisasm);
         pMyDisasm->Operand1.AccessMode = READ + WRITE;

       }
   }
   else {
       failDecode(pMyDisasm);
   }
}